

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall Builder::AddTarget(Builder *this,Node *node,string *err)

{
  bool bVar1;
  Edge *this_00;
  Edge *in_edge;
  string *err_local;
  Node *node_local;
  Builder *this_local;
  
  bVar1 = DependencyScan::RecomputeDirty(&this->scan_,node,err);
  if (bVar1) {
    this_00 = Node::in_edge(node);
    if ((this_00 == (Edge *)0x0) || (bVar1 = Edge::outputs_ready(this_00), !bVar1)) {
      bVar1 = Plan::AddTarget(&this->plan_,node,err);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Builder::AddTarget(Node* node, string* err) {
  if (!scan_.RecomputeDirty(node, err))
    return false;

  if (Edge* in_edge = node->in_edge()) {
    if (in_edge->outputs_ready())
      return true;  // Nothing to do.
  }

  if (!plan_.AddTarget(node, err))
    return false;

  return true;
}